

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O2

void __thiscall QAlphaPaintEngine::flushAndInit(QAlphaPaintEngine *this,bool init)

{
  long lVar1;
  QAlphaPaintEnginePrivate *this_00;
  QPen *pQVar2;
  QBrush *pQVar3;
  QFont *pQVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QRegion *pQVar10;
  QPainter *pQVar11;
  QTransform *pQVar12;
  QRect *r;
  QRect *pQVar13;
  QPicture *this_01;
  QPaintEngine *pQVar14;
  qreal qVar15;
  type this_02;
  long *plVar16;
  type pQVar17;
  long lVar18;
  qreal *pqVar19;
  QAlphaPaintEnginePrivate *pQVar20;
  QRect *rect;
  long in_FS_OFFSET;
  byte bVar21;
  double dVar22;
  QRectF local_b0;
  QRegion oldAlphaRegion;
  QTransform mtx;
  
  bVar21 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAlphaPaintEnginePrivate **)&this->field_0x18;
  if (this_00->m_pic != (QPicture *)0x0) {
    QPainter::end();
    pQVar10 = &this_00->m_alphargn;
    iVar6 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,1);
    iVar7 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,2);
    mtx.m_matrix[0][0] = 0.0;
    mtx.m_matrix[0][1] = (qreal)CONCAT44(iVar7 + -1,iVar6 + -1);
    QRegion::intersected((QRect *)&local_b0);
    qVar15 = *(qreal *)&this_00->m_alphargn;
    *(qreal *)&this_00->m_alphargn = local_b0.xp;
    local_b0.xp = qVar15;
    QRegion::~QRegion((QRegion *)&local_b0);
    iVar6 = QRegion::rectCount();
    if (10 < iVar6) {
      mtx.m_matrix[0]._0_16_ = QRegion::boundingRect();
      QRegion::QRegion((QRegion *)&local_b0,&mtx,0);
      qVar15 = *(qreal *)pQVar10;
      *(qreal *)pQVar10 = local_b0.xp;
      local_b0.xp = qVar15;
      QRegion::~QRegion((QRegion *)&local_b0);
    }
    _oldAlphaRegion = 0xaaaaaaaaaaaaaaaa;
    pQVar10 = (QRegion *)QRegion::operator=(&this_00->m_cliprgn,pQVar10);
    QRegion::QRegion(&oldAlphaRegion,pQVar10);
    this_00->m_pass = this_00->m_pass + 1;
    *(Int *)&this->field_0x10 =
         (this_00->m_savedcaps).super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
         super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i;
    QPaintEngine::painter();
    QPainter::save();
    pQVar20 = (QAlphaPaintEnginePrivate *)this;
    pQVar11 = (QPainter *)QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState(pQVar20,pQVar11);
    pqVar19 = (qreal *)&DAT_00149040;
    pQVar12 = &mtx;
    for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar19;
      pqVar19 = pqVar19 + (ulong)bVar21 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    pqVar19 = (qreal *)&DAT_001490c0;
    pQVar12 = &mtx;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar19;
      pqVar19 = pqVar19 + (ulong)bVar21 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    mtx._72_2_ = 0xa800;
    iVar6 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,7);
    iVar7 = qt_defaultDpiX();
    iVar8 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,8);
    iVar9 = qt_defaultDpiY();
    QTransform::scale(1.0 / ((double)iVar6 / (double)iVar7),1.0 / ((double)iVar8 / (double)iVar9));
    pQVar12 = (QTransform *)QPaintEngine::painter();
    QPainter::setTransform(pQVar12,SUB81(&mtx,0));
    pQVar11 = (QPainter *)QPaintEngine::painter();
    QPainter::drawPicture(pQVar11,0,0,this_00->m_pic);
    QRegion::QRegion((QRegion *)&local_b0);
    qVar15 = *(qreal *)&this_00->m_cliprgn;
    *(qreal *)&this_00->m_cliprgn = local_b0.xp;
    local_b0.xp = qVar15;
    QRegion::~QRegion((QRegion *)&local_b0);
    pQVar20 = (QAlphaPaintEnginePrivate *)this;
    pQVar11 = (QPainter *)QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState(pQVar20,pQVar11);
    r = (QRect *)QRegion::begin();
    pQVar13 = (QRect *)QRegion::end();
    for (; r != pQVar13; r = r + 1) {
      QRectF::QRectF(&local_b0,r);
      QAlphaPaintEnginePrivate::drawAlphaImage(this_00,&local_b0);
    }
    QRegion::QRegion((QRegion *)&local_b0);
    qVar15 = *(qreal *)&this_00->m_alphargn;
    *(qreal *)&this_00->m_alphargn = local_b0.xp;
    local_b0.xp = qVar15;
    QRegion::~QRegion((QRegion *)&local_b0);
    QPaintEngine::painter();
    QPainter::restore();
    this_00->m_pass = this_00->m_pass + -1;
    cleanUp(this);
    QRegion::~QRegion(&oldAlphaRegion);
  }
  if (init) {
    *(undefined4 *)&this->field_0x10 = 0xfffeffff;
    this_01 = (QPicture *)operator_new(0x18);
    QPicture::QPicture(this_01,-1);
    this_00->m_pic = this_01;
    *(undefined1 *)(*(long *)(this_01 + 0x10) + 0x50) = 1;
    pQVar11 = (QPainter *)operator_new(8);
    QPainter::QPainter(pQVar11,(QPaintDevice *)this_01);
    this_00->m_picpainter = pQVar11;
    pQVar14 = (QPaintEngine *)QPainter::paintEngine();
    this_00->m_picengine = pQVar14;
    pQVar2 = (QPen *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::pen();
    QPainter::setPen(pQVar2);
    pQVar3 = (QBrush *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::brush();
    QPainter::setBrush(pQVar3);
    pQVar11 = this_00->m_picpainter;
    QPaintEngine::painter();
    qVar15 = (qreal)QPainter::brushOrigin();
    mtx.m_matrix[0][0] = qVar15;
    QPainter::setBrushOrigin(pQVar11,(QPoint *)&mtx);
    pQVar4 = (QFont *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::font();
    QPainter::setFont(pQVar4);
    QPaintEngine::painter();
    dVar22 = (double)QPainter::opacity();
    QPainter::setOpacity(dVar22);
    pQVar11 = this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::combinedTransform();
    QPainter::setTransform((QTransform *)pQVar11,SUB81(&mtx,0));
    QPaintEngine::syncState();
    this_02 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator*
                        ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                         (*(long *)this_00->m_picpainter + 0x40));
    uVar5 = *(undefined8 *)(this_02 + 0x1a8);
    plVar16 = (long *)QPaintEngine::painter();
    pQVar17 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator*
                        ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                         (*plVar16 + 0x40));
    QPainterState::operator=(this_02,pQVar17);
    *(undefined8 *)(this_02 + 0x1a8) = uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaPaintEngine::flushAndInit(bool init)
{
    Q_D(QAlphaPaintEngine);
    Q_ASSERT(d->m_pass == 0);

    if (d->m_pic) {
        d->m_picpainter->end();

        // set clip region
        d->m_alphargn = d->m_alphargn.intersected(QRect(0, 0, d->m_pdev->width(), d->m_pdev->height()));

        // just use the bounding rect if it's a complex region..
        if (d->m_alphargn.rectCount() > 10) {
            QRect br = d->m_alphargn.boundingRect();
            d->m_alphargn = QRegion(br);
        }

        const auto oldAlphaRegion = d->m_cliprgn = d->m_alphargn;

        // now replay the QPicture
        ++d->m_pass; // we are now doing pass #2

        // reset states
        gccaps = d->m_savedcaps;

        painter()->save();
        d->resetState(painter());

        // make sure the output from QPicture is unscaled
        QTransform mtx;
        mtx.scale(1.0f / (qreal(d->m_pdev->logicalDpiX()) / qreal(qt_defaultDpiX())),
                  1.0f / (qreal(d->m_pdev->logicalDpiY()) / qreal(qt_defaultDpiY())));
        painter()->setTransform(mtx);
        painter()->drawPicture(0, 0, *d->m_pic);

        d->m_cliprgn = QRegion();
        d->resetState(painter());

        // fill in the alpha images
        for (const auto &rect : oldAlphaRegion)
            d->drawAlphaImage(rect);

        d->m_alphargn = QRegion();

        painter()->restore();

        --d->m_pass; // pass #2 finished

        cleanUp();
    }

    if (init) {
        gccaps = PaintEngineFeatures(AllFeatures & ~QPaintEngine::ObjectBoundingModeGradients);

        d->m_pic = new QPicture();
        d->m_pic->d_ptr->in_memory_only = true;
        d->m_picpainter = new QPainter(d->m_pic);
        d->m_picengine = d->m_picpainter->paintEngine();

        // When newPage() is called and the m_picpainter is recreated
        // we have to copy the current state of the original printer
        // painter back to the m_picpainter
        d->m_picpainter->setPen(painter()->pen());
        d->m_picpainter->setBrush(painter()->brush());
        d->m_picpainter->setBrushOrigin(painter()->brushOrigin());
        d->m_picpainter->setFont(painter()->font());
        d->m_picpainter->setOpacity(painter()->opacity());
        d->m_picpainter->setTransform(painter()->combinedTransform());
        d->m_picengine->syncState();
        QPainterState &state = *d->m_picpainter->d_func()->state;
        QPainter *oldPainter = state.painter;
        state = *painter()->d_func()->state;
        state.painter = oldPainter;
    }
}